

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O2

void __thiscall
aeron::archive::AeronArchive::pollNextResponse
          (AeronArchive *this,int64_t correlationId,TimePoint *deadline)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ArchiveException *pAVar4;
  char *pcVar5;
  undefined8 in_RCX;
  TimePoint *__nfds;
  TimePoint *extraout_RDX;
  TimePoint *extraout_RDX_00;
  allocator local_ba;
  allocator local_b9;
  undefined1 local_b8 [40];
  string local_90;
  string local_70;
  string local_50;
  
  __nfds = deadline;
  local_b8._32_8_ = correlationId;
  while( true ) {
    do {
      iVar2 = ControlResponsePoller::poll
                        ((this->controlResponsePoller_)._M_t.
                         super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                         _M_head_impl,(pollfd *)correlationId,(nfds_t)__nfds,(int)in_RCX);
      bVar1 = ControlResponsePoller::isPollComplete
                        ((this->controlResponsePoller_)._M_t.
                         super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                         _M_head_impl);
      if (bVar1) {
        return;
      }
      __nfds = extraout_RDX;
    } while (0 < iVar2);
    correlationId =
         (int64_t)(this->controlResponsePoller_)._M_t.
                  super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                  .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                  _M_head_impl;
    ControlResponsePoller::subscription((ControlResponsePoller *)local_b8);
    bVar1 = Subscription::isConnected((Subscription *)local_b8._0_8_);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
    if (!bVar1) break;
    lVar3 = std::chrono::_V2::system_clock::now();
    if ((deadline->__d).__r < lVar3) {
      pAVar4 = (ArchiveException *)__cxa_allocate_exception(0x48);
      std::__cxx11::to_string((string *)(local_b8 + 0x48),local_b8._32_8_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                     "awaiting response for correlationId=",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_b8 + 0x48));
      std::__cxx11::string::string
                ((string *)(local_b8 + 0x28),
                 "void aeron::archive::AeronArchive::pollNextResponse(std::int64_t, const TimePoint &)"
                 ,&local_b9);
      pcVar5 = aeron::util::past_prefix
                         ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                         );
      std::__cxx11::string::string((string *)&local_50,pcVar5,&local_ba);
      ArchiveException::ArchiveException
                (pAVar4,(string *)local_b8,(string *)(local_b8 + 0x28),&local_50,0x18c);
      __cxa_throw(pAVar4,&ArchiveException::typeinfo,
                  aeron::util::SourcedException::~SourcedException);
    }
    sched_yield();
    concurrent::AgentInvoker<aeron::ClientConductor>::invoke
              (&((this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->m_conductorInvoker);
    __nfds = extraout_RDX_00;
  }
  pAVar4 = (ArchiveException *)__cxa_allocate_exception(0x48);
  std::__cxx11::string::string
            ((string *)local_b8,"subscription to archive is not connected",(allocator *)&local_50);
  std::__cxx11::string::string
            ((string *)(local_b8 + 0x48),
             "void aeron::archive::AeronArchive::pollNextResponse(std::int64_t, const TimePoint &)",
             &local_b9);
  pcVar5 = aeron::util::past_prefix
                     ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                     );
  std::__cxx11::string::string((string *)(local_b8 + 0x28),pcVar5,&local_ba);
  ArchiveException::ArchiveException
            (pAVar4,(string *)local_b8,(string *)(local_b8 + 0x48),(string *)(local_b8 + 0x28),0x188
            );
  __cxa_throw(pAVar4,&ArchiveException::typeinfo,aeron::util::SourcedException::~SourcedException);
}

Assistant:

void AeronArchive::pollNextResponse(std::int64_t correlationId, const TimePoint& deadline) {
    while (true) {
        std::int32_t fragments = controlResponsePoller_->poll();

        if (controlResponsePoller_->isPollComplete()) {
            break;
        }

        if (fragments > 0) {
            continue;
        }

        if (!controlResponsePoller_->subscription()->isConnected()) {
            throw ArchiveException("subscription to archive is not connected", SOURCEINFO);
        }

        if (Clock::now() > deadline) {
            throw ArchiveException("awaiting response for correlationId=" + std::to_string(correlationId), SOURCEINFO);
        }

        idleStrategy_.idle();
        aeron_->conductorAgentInvoker().invoke();
    }
}